

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::SearchPCRE(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  bool bVar1;
  string *__lhs;
  ostream *poVar2;
  LogMessage local_510;
  LogMessage local_390;
  LogMessage local_210;
  undefined1 local_80 [8];
  PCRE re;
  int i;
  bool expect_match_local;
  Anchor anchor_local;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  for (re.hit_limit_ = 0; re.hit_limit_ < iters; re.hit_limit_ = re.hit_limit_ + 1) {
    PCRE::PCRE((PCRE *)local_80,regexp,EnabledCompileOptions);
    __lhs = PCRE::error_abi_cxx11_((PCRE *)local_80);
    bVar1 = std::operator==(__lhs,"");
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x3ab);
      poVar2 = LogMessage::stream(&local_210);
      std::operator<<(poVar2,"Check failed: (re.error()) == (\"\")");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_210);
    }
    if (anchor == kAnchored) {
      bVar1 = PCRE::FullMatchFunctor::operator()
                        ((FullMatchFunctor *)&PCRE::FullMatch,text,(PCRE *)local_80,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
      if (bVar1 != expect_match) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_390,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x3ad);
        poVar2 = LogMessage::stream(&local_390);
        std::operator<<(poVar2,"Check failed: (PCRE::FullMatch(text, re)) == (expect_match)");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_390);
      }
    }
    else {
      bVar1 = PCRE::PartialMatchFunctor::operator()
                        ((PartialMatchFunctor *)&PCRE::PartialMatch,text,(PCRE *)local_80,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
      if (bVar1 != expect_match) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_510,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x3af);
        poVar2 = LogMessage::stream(&local_510);
        std::operator<<(poVar2,"Check failed: (PCRE::PartialMatch(text, re)) == (expect_match)");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_510);
      }
    }
    PCRE::~PCRE((PCRE *)local_80);
  }
  return;
}

Assistant:

void SearchPCRE(int iters, const char* regexp, const StringPiece& text,
                Prog::Anchor anchor, bool expect_match) {
  for (int i = 0; i < iters; i++) {
    PCRE re(regexp, PCRE::UTF8);
    CHECK_EQ(re.error(), "");
    if (anchor == Prog::kAnchored)
      CHECK_EQ(PCRE::FullMatch(text, re), expect_match);
    else
      CHECK_EQ(PCRE::PartialMatch(text, re), expect_match);
  }
}